

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz-test.c++
# Opt level: O2

void capnp::_::anon_unknown_0::fuzz<capnp::_::(anonymous_namespace)::ListChecker>
               (ArrayPtr<capnp::word> data,uint flipCount,uint startAt,uint endAt)

{
  byte *pbVar1;
  byte bVar2;
  uint flipCount_00;
  byte bVar3;
  word *pwVar4;
  ulong uVar5;
  undefined1 in_stack_00000010 [16];
  
  pwVar4 = data.ptr;
  if (flipCount != 0) {
    flipCount_00 = flipCount - 1;
    while (startAt < 0xc0) {
      uVar5 = (ulong)(startAt >> 3);
      bVar2 = *(byte *)((long)&pwVar4->content + uVar5);
      bVar3 = (byte)(1 << ((byte)startAt & 7));
      *(byte *)((long)&pwVar4->content + uVar5) = bVar2 | bVar3;
      startAt = startAt + 1;
      fuzz<capnp::_::(anonymous_namespace)::ListChecker>(data,flipCount_00,startAt,endAt);
      pbVar1 = (byte *)((long)&pwVar4->content + uVar5);
      *pbVar1 = *pbVar1 & ~bVar3;
      fuzz<capnp::_::(anonymous_namespace)::ListChecker>(data,flipCount_00,startAt,endAt);
      *(byte *)((long)&pwVar4->content + uVar5) = bVar3;
      fuzz<capnp::_::(anonymous_namespace)::ListChecker>(data,flipCount_00,startAt,endAt);
      *(byte *)((long)&pwVar4->content + uVar5) = bVar2;
    }
    return;
  }
  traverseCatchingExceptions<capnp::_::(anonymous_namespace)::ListChecker>
            ((ArrayPtr<const_capnp::word>)in_stack_00000010);
  return;
}

Assistant:

void fuzz(kj::ArrayPtr<word> data, uint flipCount, uint startAt, uint endAt) {
  if (flipCount == 0) {
    traverseCatchingExceptions<Checker>(data);
  } else {
    for (uint i = startAt; i < endAt; i++) {
      byte bit = 1u << (i % 8);
      byte old = data.asBytes()[i / 8];
      data.asBytes()[i / 8] |= bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] &= ~bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] = bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] = old;
    }
  }
}